

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StructuredAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter_const,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
          (BumpAllocator *this,Type *args,
          span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
          *args_1,span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                  *args_2,
          span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
          *args_3,Expression **args_4,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_5,SourceRange *args_6)

{
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  typeSetters;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  memberSetters;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  indexSetters;
  SourceRange sourceRange;
  StructuredAssignmentPatternExpression *pSVar1;
  Type *in_RSI;
  undefined8 *in_R8;
  SourceLocation in_R9;
  size_t *in_stack_00000010;
  span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  *in_stack_ffffffffffffff28;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  *in_stack_ffffffffffffff30;
  BumpAllocator *in_stack_ffffffffffffff38;
  StructuredAssignmentPatternExpression *this_00;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff80;
  pointer pIVar2;
  __extent_storage<18446744073709551615UL> _Var3;
  Expression *in_stack_ffffffffffffffa0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> in_stack_ffffffffffffffa8;
  SourceLocation in_stack_ffffffffffffffb8;
  
  pSVar1 = (StructuredAssignmentPatternExpression *)
           allocate(in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30,
                    (size_t)in_stack_ffffffffffffff28);
  std::
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  ::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  ::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
            ((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
              *)in_stack_ffffffffffffff30,
             (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
              *)in_stack_ffffffffffffff28);
  pIVar2 = (pointer)*in_R8;
  _Var3._M_extent_value = in_R8[1];
  this_00 = *(StructuredAssignmentPatternExpression **)in_R9;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff30,
             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff28);
  memberSetters._M_extent._M_extent_value = in_stack_ffffffffffffff80._M_extent_value;
  memberSetters._M_ptr = (pointer)in_stack_00000010[1];
  typeSetters._M_extent._M_extent_value = *in_stack_00000010;
  typeSetters._M_ptr = (pointer)pSVar1;
  indexSetters._M_extent._M_extent_value = _Var3._M_extent_value;
  indexSetters._M_ptr = pIVar2;
  sourceRange.endLoc = in_R9;
  sourceRange.startLoc = in_stack_ffffffffffffffb8;
  ast::StructuredAssignmentPatternExpression::StructuredAssignmentPatternExpression
            (this_00,in_RSI,memberSetters,typeSetters,indexSetters,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,sourceRange);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }